

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_alt_helpers.cpp
# Opt level: O0

int mbedtls_rsa_deduce_primes
              (mbedtls_mpi *N,mbedtls_mpi *E,mbedtls_mpi *D,mbedtls_mpi *P,mbedtls_mpi *Q)

{
  int iVar1;
  size_t sVar2;
  mbedtls_mpi *in_RCX;
  mbedtls_mpi *in_RDX;
  mbedtls_mpi *in_RSI;
  mbedtls_mpi *in_RDI;
  long *in_R8;
  mbedtls_mpi *unaff_retaddr;
  size_t num_primes;
  uchar primes [54];
  mbedtls_mpi K;
  mbedtls_mpi T;
  uint16_t order;
  uint16_t iter;
  uint16_t attempt;
  int ret;
  mbedtls_mpi *in_stack_ffffffffffffff58;
  mbedtls_mpi *X;
  mbedtls_mpi *in_stack_ffffffffffffff68;
  mbedtls_mpi *in_stack_ffffffffffffff70;
  mbedtls_mpi *in_stack_ffffffffffffff78;
  mbedtls_mpi *in_stack_ffffffffffffff80;
  mbedtls_mpi *in_stack_ffffffffffffff90;
  mbedtls_mpi *in_stack_ffffffffffffff98;
  mbedtls_mpi *in_stack_ffffffffffffffa0;
  mbedtls_mpi local_50;
  ushort local_3a;
  ushort local_38;
  ushort local_36;
  int local_34;
  long *local_30;
  mbedtls_mpi *local_28;
  mbedtls_mpi *local_20;
  mbedtls_mpi *local_18;
  mbedtls_mpi *local_10;
  int local_4;
  
  local_34 = 0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memcpy(&stack0xffffffffffffff68,&DAT_008ce1a0,0x36);
  X = (mbedtls_mpi *)0x36;
  if ((((local_28 == (mbedtls_mpi *)0x0) || (local_30 == (long *)0x0)) ||
      (local_28->p != (mbedtls_mpi_uint *)0x0)) || (*local_30 != 0)) {
    local_4 = -4;
  }
  else {
    iVar1 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffff70,
                                (mbedtls_mpi_sint)in_stack_ffffffffffffff68);
    if (((iVar1 < 1) ||
        (iVar1 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffff70,
                                     (mbedtls_mpi_sint)in_stack_ffffffffffffff68), iVar1 < 1)) ||
       ((iVar1 = mbedtls_mpi_cmp_mpi(local_20,local_10), -1 < iVar1 ||
        ((iVar1 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffff70,
                                      (mbedtls_mpi_sint)in_stack_ffffffffffffff68), iVar1 < 1 ||
         (iVar1 = mbedtls_mpi_cmp_mpi(local_18,local_10), -1 < iVar1)))))) {
      local_4 = -4;
    }
    else {
      mbedtls_mpi_init((mbedtls_mpi *)&stack0xffffffffffffffa0);
      mbedtls_mpi_init(&local_50);
      local_34 = mbedtls_mpi_mul_mpi(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                     in_stack_ffffffffffffff90);
      if ((local_34 == 0) &&
         (local_34 = mbedtls_mpi_sub_int(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                                         (mbedtls_mpi_sint)in_stack_ffffffffffffff70), local_34 == 0
         )) {
        sVar2 = mbedtls_mpi_lsb(&local_50);
        local_3a = (ushort)sVar2;
        if ((sVar2 & 0xffff) == 0) {
          local_34 = -4;
        }
        else {
          local_34 = mbedtls_mpi_shift_r(X,(size_t)in_stack_ffffffffffffff58);
          if (local_34 == 0) {
            local_34 = 0;
            for (local_36 = (ushort)((*local_10->p & 7) == 1); local_36 < 0x36;
                local_36 = local_36 + 1) {
              local_34 = mbedtls_mpi_lset(X,(mbedtls_mpi_sint)in_stack_ffffffffffffff58);
              if ((local_34 != 0) ||
                 (local_34 = mbedtls_mpi_gcd(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                                             in_stack_ffffffffffffff90), local_34 != 0))
              goto LAB_008694df;
              iVar1 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffff70,
                                          (mbedtls_mpi_sint)in_stack_ffffffffffffff68);
              if (iVar1 == 0) {
                local_34 = mbedtls_mpi_exp_mod(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,X
                                               ,in_stack_ffffffffffffff58,(mbedtls_mpi *)0x869338);
                if (local_34 != 0) goto LAB_008694df;
                local_38 = 1;
                while ((local_34 = 0, local_38 <= local_3a &&
                       (iVar1 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffff70,
                                                    (mbedtls_mpi_sint)in_stack_ffffffffffffff68),
                       iVar1 != 0))) {
                  local_34 = mbedtls_mpi_add_int(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                                                 ,(mbedtls_mpi_sint)in_stack_ffffffffffffff70);
                  if ((local_34 != 0) ||
                     (local_34 = mbedtls_mpi_gcd(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98
                                                 ,in_stack_ffffffffffffff90), local_34 != 0))
                  goto LAB_008694df;
                  iVar1 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffff70,
                                              (mbedtls_mpi_sint)in_stack_ffffffffffffff68);
                  if ((iVar1 == 1) && (iVar1 = mbedtls_mpi_cmp_mpi(local_28,local_10), iVar1 == -1))
                  {
                    local_34 = mbedtls_mpi_div_mpi((mbedtls_mpi *)primes._8_8_,
                                                   (mbedtls_mpi *)primes._0_8_,
                                                   (mbedtls_mpi *)num_primes,unaff_retaddr);
                    goto LAB_008694df;
                  }
                  local_34 = mbedtls_mpi_sub_int(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
                                                 ,(mbedtls_mpi_sint)in_stack_ffffffffffffff70);
                  if (((local_34 != 0) ||
                      (local_34 = mbedtls_mpi_mul_mpi(in_stack_ffffffffffffffa0,
                                                      in_stack_ffffffffffffff98,
                                                      in_stack_ffffffffffffff90), local_34 != 0)) ||
                     (local_34 = mbedtls_mpi_mod_mpi(in_stack_ffffffffffffff68,X,
                                                     in_stack_ffffffffffffff58), local_34 != 0))
                  goto LAB_008694df;
                  local_38 = local_38 + 1;
                }
                iVar1 = mbedtls_mpi_cmp_int(in_stack_ffffffffffffff70,
                                            (mbedtls_mpi_sint)in_stack_ffffffffffffff68);
                if (iVar1 != 0) break;
              }
            }
            local_34 = -4;
          }
        }
      }
LAB_008694df:
      mbedtls_mpi_free((mbedtls_mpi *)0x8694e9);
      mbedtls_mpi_free((mbedtls_mpi *)0x8694f3);
      local_4 = local_34;
    }
  }
  return local_4;
}

Assistant:

int mbedtls_rsa_deduce_primes(mbedtls_mpi const *N,
                              mbedtls_mpi const *E, mbedtls_mpi const *D,
                              mbedtls_mpi *P, mbedtls_mpi *Q)
{
    int ret = 0;

    uint16_t attempt;  /* Number of current attempt  */
    uint16_t iter;     /* Number of squares computed in the current attempt */

    uint16_t order;    /* Order of 2 in DE - 1 */

    mbedtls_mpi T;  /* Holds largest odd divisor of DE - 1     */
    mbedtls_mpi K;  /* Temporary holding the current candidate */

    const unsigned char primes[] = { 2,
                                     3,    5,    7,   11,   13,   17,   19,   23,
                                     29,   31,   37,   41,   43,   47,   53,   59,
                                     61,   67,   71,   73,   79,   83,   89,   97,
                                     101,  103,  107,  109,  113,  127,  131,  137,
                                     139,  149,  151,  157,  163,  167,  173,  179,
                                     181,  191,  193,  197,  199,  211,  223,  227,
                                     229,  233,  239,  241,  251 };

    const size_t num_primes = sizeof(primes) / sizeof(*primes);

    if (P == NULL || Q == NULL || P->p != NULL || Q->p != NULL) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    if (mbedtls_mpi_cmp_int(N, 0) <= 0 ||
        mbedtls_mpi_cmp_int(D, 1) <= 0 ||
        mbedtls_mpi_cmp_mpi(D, N) >= 0 ||
        mbedtls_mpi_cmp_int(E, 1) <= 0 ||
        mbedtls_mpi_cmp_mpi(E, N) >= 0) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    /*
     * Initializations and temporary changes
     */

    mbedtls_mpi_init(&K);
    mbedtls_mpi_init(&T);

    /* T := DE - 1 */
    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&T, D,  E));
    MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&T, &T, 1));

    if ((order = (uint16_t) mbedtls_mpi_lsb(&T)) == 0) {
        ret = MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        goto cleanup;
    }

    /* After this operation, T holds the largest odd divisor of DE - 1. */
    MBEDTLS_MPI_CHK(mbedtls_mpi_shift_r(&T, order));

    /*
     * Actual work
     */

    /* Skip trying 2 if N == 1 mod 8 */
    attempt = 0;
    if (N->p[0] % 8 == 1) {
        attempt = 1;
    }

    for (; attempt < num_primes; ++attempt) {
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(&K, primes[attempt]));

        /* Check if gcd(K,N) = 1 */
        MBEDTLS_MPI_CHK(mbedtls_mpi_gcd(P, &K, N));
        if (mbedtls_mpi_cmp_int(P, 1) != 0) {
            continue;
        }

        /* Go through K^T + 1, K^(2T) + 1, K^(4T) + 1, ...
         * and check whether they have nontrivial GCD with N. */
        MBEDTLS_MPI_CHK(mbedtls_mpi_exp_mod(&K, &K, &T, N,
                                            Q /* temporarily use Q for storing Montgomery
                                               * multiplication helper values */));

        for (iter = 1; iter <= order; ++iter) {
            /* If we reach 1 prematurely, there's no point
             * in continuing to square K */
            if (mbedtls_mpi_cmp_int(&K, 1) == 0) {
                break;
            }

            MBEDTLS_MPI_CHK(mbedtls_mpi_add_int(&K, &K, 1));
            MBEDTLS_MPI_CHK(mbedtls_mpi_gcd(P, &K, N));

            if (mbedtls_mpi_cmp_int(P, 1) ==  1 &&
                mbedtls_mpi_cmp_mpi(P, N) == -1) {
                /*
                 * Have found a nontrivial divisor P of N.
                 * Set Q := N / P.
                 */

                MBEDTLS_MPI_CHK(mbedtls_mpi_div_mpi(Q, NULL, N, P));
                goto cleanup;
            }

            MBEDTLS_MPI_CHK(mbedtls_mpi_sub_int(&K, &K, 1));
            MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(&K, &K, &K));
            MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&K, &K, N));
        }

        /*
         * If we get here, then either we prematurely aborted the loop because
         * we reached 1, or K holds primes[attempt]^(DE - 1) mod N, which must
         * be 1 if D,E,N were consistent.
         * Check if that's the case and abort if not, to avoid very long,
         * yet eventually failing, computations if N,D,E were not sane.
         */
        if (mbedtls_mpi_cmp_int(&K, 1) != 0) {
            break;
        }
    }

    ret = MBEDTLS_ERR_MPI_BAD_INPUT_DATA;

cleanup:

    mbedtls_mpi_free(&K);
    mbedtls_mpi_free(&T);
    return ret;
}